

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_new.c
# Opt level: O0

int asn1_item_embed_new(ASN1_VALUE **pval,ASN1_ITEM *it,int embed,OSSL_LIB_CTX *libctx,char *propq)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  ASN1_VALUE *pAVar4;
  ASN1_VALUE **in_RCX;
  ASN1_ITEM *it_00;
  int in_EDX;
  ASN1_ITEM *in_RSI;
  ASN1_VALUE **in_RDI;
  ASN1_TEMPLATE *in_R8;
  int i;
  ASN1_VALUE **pseqval;
  ASN1_aux_cb *asn1_cb;
  ASN1_AUX *aux;
  ASN1_EXTERN_FUNCS *ef;
  ASN1_TEMPLATE *tt;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  ASN1_VALUE **in_stack_ffffffffffffffa8;
  code *file;
  ASN1_ITEM *it_01;
  ASN1_ITEM *in_stack_ffffffffffffffc0;
  ASN1_VALUE **pval_00;
  OSSL_LIB_CTX *libctx_00;
  
  pval_00 = (ASN1_VALUE **)0x0;
  it_01 = (ASN1_ITEM *)in_RSI->funcs;
  if ((it_01 == (ASN1_ITEM *)0x0) || (it_01->tcount == 0)) {
    file = (code *)0x0;
  }
  else {
    file = (code *)it_01->tcount;
  }
  it_00 = (ASN1_ITEM *)(ulong)(uint)(int)in_RSI->itype;
  iVar3 = (int)((ulong)it_01 >> 0x20);
  switch(it_00) {
  case (ASN1_ITEM *)0x0:
    if (in_RSI->templates == (ASN1_TEMPLATE *)0x0) {
      iVar2 = asn1_primitive_new((ASN1_VALUE **)0x0,in_stack_ffffffffffffffc0,iVar3);
      iVar3 = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
    }
    else {
      iVar2 = asn1_template_new(in_RCX,in_R8,(OSSL_LIB_CTX *)0x0,&in_stack_ffffffffffffffc0->itype);
      iVar3 = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
    }
    break;
  case (ASN1_ITEM *)0x1:
  case (ASN1_ITEM *)0x6:
    if (file != (code *)0x0) {
      in_stack_ffffffffffffffa4 = (*file)(0,in_RDI,in_RSI,0);
      if (in_stack_ffffffffffffffa4 == 0) {
        in_stack_ffffffffffffffa4 = 0;
        goto LAB_003816c7;
      }
      if (in_stack_ffffffffffffffa4 == 2) {
        return 1;
      }
    }
    if (in_EDX == 0) {
      pAVar4 = (ASN1_VALUE *)
               CRYPTO_zalloc((size_t)file,(char *)in_stack_ffffffffffffffa8,
                             in_stack_ffffffffffffffa4);
      iVar3 = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
      *in_RDI = pAVar4;
      if (*in_RDI == (ASN1_VALUE *)0x0) goto LAB_00381678;
    }
    else {
      memset(*in_RDI,0,in_RSI->size);
    }
    iVar2 = ossl_asn1_do_lock(pval_00,(int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),it_01);
    iVar3 = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
    if (iVar2 < 0) {
      if (in_EDX == 0) {
        CRYPTO_free(*in_RDI);
        *in_RDI = (ASN1_VALUE *)0x0;
      }
      goto LAB_00381678;
    }
    ossl_asn1_enc_init((ASN1_VALUE **)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       it_00);
    libctx_00 = (OSSL_LIB_CTX *)in_RSI->templates;
    for (in_stack_ffffffffffffffa4 = 0; (long)in_stack_ffffffffffffffa4 < in_RSI->tcount;
        in_stack_ffffffffffffffa4 = in_stack_ffffffffffffffa4 + 1) {
      in_stack_ffffffffffffffa8 = ossl_asn1_get_field_ptr(in_RDI,(ASN1_TEMPLATE *)libctx_00);
      iVar2 = asn1_template_new(in_RCX,in_R8,libctx_00,&in_stack_ffffffffffffffc0->itype);
      iVar3 = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
      if (iVar2 == 0) {
        ossl_asn1_item_embed_free(in_RDI,in_RSI,in_EDX);
        goto LAB_00381678;
      }
      libctx_00 = (OSSL_LIB_CTX *)((libctx_00->global).ex_data + 1);
    }
    if (file == (code *)0x0) {
      return 1;
    }
    iVar3 = (*file)(1,in_RDI,in_RSI,0);
    goto joined_r0x003814bb;
  case (ASN1_ITEM *)0x2:
    if (file != (code *)0x0) {
      in_stack_ffffffffffffffa4 = (*file)(0,in_RDI,in_RSI,0);
      if (in_stack_ffffffffffffffa4 == 0) goto LAB_003816c7;
      if (in_stack_ffffffffffffffa4 == 2) {
        return 1;
      }
    }
    if (in_EDX == 0) {
      pAVar4 = (ASN1_VALUE *)
               CRYPTO_zalloc((size_t)file,(char *)in_stack_ffffffffffffffa8,
                             in_stack_ffffffffffffffa4);
      iVar3 = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
      *in_RDI = pAVar4;
      if (*in_RDI == (ASN1_VALUE *)0x0) goto LAB_00381678;
    }
    else {
      memset(*in_RDI,0,in_RSI->size);
    }
    ossl_asn1_set_choice_selector(in_RDI,-1,in_RSI);
    if (file == (code *)0x0) {
      return 1;
    }
    iVar3 = (*file)(1,in_RDI,in_RSI,0);
joined_r0x003814bb:
    if (iVar3 != 0) {
      return 1;
    }
    ossl_asn1_item_embed_free(in_RDI,in_RSI,in_EDX);
LAB_003816c7:
    iVar3 = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
    ERR_new();
    ERR_set_debug((char *)file,iVar3,
                  (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    ERR_set_error(0xd,100,(char *)0x0);
    return 0;
  default:
    goto LAB_00381701;
  case (ASN1_ITEM *)0x4:
    pvVar1 = in_RSI->funcs;
    if (pvVar1 == (void *)0x0) {
      return 1;
    }
    if (*(long *)((long)pvVar1 + 0x38) == 0) {
      if (*(long *)((long)pvVar1 + 8) == 0) {
        return 1;
      }
      iVar2 = (**(code **)((long)pvVar1 + 8))(in_RDI,in_RSI);
      iVar3 = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
    }
    else {
      iVar2 = (**(code **)((long)pvVar1 + 0x38))(in_RDI,in_RSI,in_RCX,in_R8);
      iVar3 = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
    }
    break;
  case (ASN1_ITEM *)0x5:
    iVar2 = asn1_primitive_new((ASN1_VALUE **)0x0,in_stack_ffffffffffffffc0,iVar3);
    iVar3 = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  }
  if (iVar2 == 0) {
LAB_00381678:
    ERR_new();
    ERR_set_debug((char *)file,iVar3,
                  (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    ERR_set_error(0xd,0xc0100,(char *)0x0);
    return 0;
  }
LAB_00381701:
  return 1;
}

Assistant:

int asn1_item_embed_new(ASN1_VALUE **pval, const ASN1_ITEM *it, int embed,
                        OSSL_LIB_CTX *libctx, const char *propq)
{
    const ASN1_TEMPLATE *tt = NULL;
    const ASN1_EXTERN_FUNCS *ef;
    const ASN1_AUX *aux = it->funcs;
    ASN1_aux_cb *asn1_cb;
    ASN1_VALUE **pseqval;
    int i;
    if (aux && aux->asn1_cb)
        asn1_cb = aux->asn1_cb;
    else
        asn1_cb = 0;

    switch (it->itype) {

    case ASN1_ITYPE_EXTERN:
        ef = it->funcs;
        if (ef != NULL) {
            if (ef->asn1_ex_new_ex != NULL) {
                if (!ef->asn1_ex_new_ex(pval, it, libctx, propq))
                    goto memerr;
            } else if (ef->asn1_ex_new != NULL) {
                if (!ef->asn1_ex_new(pval, it))
                    goto memerr;
            }
        }
        break;

    case ASN1_ITYPE_PRIMITIVE:
        if (it->templates) {
            if (!asn1_template_new(pval, it->templates, libctx, propq))
                goto memerr;
        } else if (!asn1_primitive_new(pval, it, embed))
            goto memerr;
        break;

    case ASN1_ITYPE_MSTRING:
        if (!asn1_primitive_new(pval, it, embed))
            goto memerr;
        break;

    case ASN1_ITYPE_CHOICE:
        if (asn1_cb) {
            i = asn1_cb(ASN1_OP_NEW_PRE, pval, it, NULL);
            if (!i)
                goto auxerr;
            if (i == 2) {
                return 1;
            }
        }
        if (embed) {
            memset(*pval, 0, it->size);
        } else {
            *pval = OPENSSL_zalloc(it->size);
            if (*pval == NULL)
                goto memerr;
        }
        ossl_asn1_set_choice_selector(pval, -1, it);
        if (asn1_cb && !asn1_cb(ASN1_OP_NEW_POST, pval, it, NULL))
            goto auxerr2;
        break;

    case ASN1_ITYPE_NDEF_SEQUENCE:
    case ASN1_ITYPE_SEQUENCE:
        if (asn1_cb) {
            i = asn1_cb(ASN1_OP_NEW_PRE, pval, it, NULL);
            if (!i)
                goto auxerr;
            if (i == 2) {
                return 1;
            }
        }
        if (embed) {
            memset(*pval, 0, it->size);
        } else {
            *pval = OPENSSL_zalloc(it->size);
            if (*pval == NULL)
                goto memerr;
        }
        /* 0 : init. lock */
        if (ossl_asn1_do_lock(pval, 0, it) < 0) {
            if (!embed) {
                OPENSSL_free(*pval);
                *pval = NULL;
            }
            goto memerr;
        }
        ossl_asn1_enc_init(pval, it);
        for (i = 0, tt = it->templates; i < it->tcount; tt++, i++) {
            pseqval = ossl_asn1_get_field_ptr(pval, tt);
            if (!asn1_template_new(pseqval, tt, libctx, propq))
                goto memerr2;
        }
        if (asn1_cb && !asn1_cb(ASN1_OP_NEW_POST, pval, it, NULL))
            goto auxerr2;
        break;
    }
    return 1;

 memerr2:
    ossl_asn1_item_embed_free(pval, it, embed);
 memerr:
    ERR_raise(ERR_LIB_ASN1, ERR_R_MALLOC_FAILURE);
    return 0;

 auxerr2:
    ossl_asn1_item_embed_free(pval, it, embed);
 auxerr:
    ERR_raise(ERR_LIB_ASN1, ASN1_R_AUX_ERROR);
    return 0;

}